

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoaderDriver.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  AlternativeLoader *this;
  Map *this_00;
  MapLoaderAdapter *this_01;
  undefined4 extraout_var;
  Map *fourthMap;
  MapLoaderAdapter *adapter;
  Map *thirdMap;
  AlternativeLoader *altLoader;
  undefined1 local_f0 [8];
  string MAP3;
  Map *secondMap;
  allocator<char> local_a1;
  string local_a0 [8];
  string MAP2;
  Map *firstMap;
  undefined1 local_58 [8];
  MapLoader myLoader;
  allocator<char> local_31;
  string local_30 [8];
  string MAP1;
  
  MAP1.field_2._12_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,"debugValid.map",&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::__cxx11::string::string((string *)&firstMap,local_30);
  MapLoader::MapLoader((MapLoader *)local_58,(string *)&firstMap);
  std::__cxx11::string::~string((string *)&firstMap);
  std::operator<<((ostream *)&std::cout,"creating map 1 (valid)\n");
  MAP2.field_2._8_8_ = MapLoader::readMapFile((MapLoader *)local_58);
  std::operator<<((ostream *)&std::cout,"\nmap 1 creation completed.\n");
  if (MAP2.field_2._8_8_ != 0) {
    Map::printMap((Map *)MAP2.field_2._8_8_);
  }
  std::operator<<((ostream *)&std::cout,"\n\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a0,"world2Invalid.map",&local_a1);
  std::allocator<char>::~allocator(&local_a1);
  std::__cxx11::string::string((string *)&secondMap,local_a0);
  MapLoader::setMapFile((MapLoader *)local_58,(string *)&secondMap);
  std::__cxx11::string::~string((string *)&secondMap);
  std::operator<<((ostream *)&std::cout,"\ncreating map 2 (invalid)\n");
  MAP3.field_2._8_8_ = MapLoader::readMapFile((MapLoader *)local_58);
  std::operator<<((ostream *)&std::cout,"map 2 creation attempt completed.\n");
  if (MAP3.field_2._8_8_ != 0) {
    Map::printMap((Map *)MAP3.field_2._8_8_);
  }
  std::operator<<((ostream *)&std::cout,"\n\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f0,"africa.map",(allocator<char> *)((long)&altLoader + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&altLoader + 7));
  this = (AlternativeLoader *)operator_new(8);
  AlternativeLoader::AlternativeLoader(this,(string *)local_f0);
  std::operator<<((ostream *)&std::cout,"creating map 3 using alternative loader directly (valid)\n"
                 );
  this_00 = AlternativeLoader::altReadMapFile(this);
  std::operator<<((ostream *)&std::cout,"\nmap 3 creation completed.\n");
  if (this_00 != (Map *)0x0) {
    Map::printMap(this_00);
  }
  std::operator<<((ostream *)&std::cout,"\n\n");
  std::operator<<((ostream *)&std::cout,"creating map 4 using adapter (valid)\n");
  this_01 = (MapLoaderAdapter *)operator_new(0x18);
  MapLoaderAdapter::MapLoaderAdapter(this_01,this);
  iVar1 = (*(this_01->super_MapLoader)._vptr_MapLoader[2])();
  if ((Map *)CONCAT44(extraout_var,iVar1) != (Map *)0x0) {
    Map::printMap((Map *)CONCAT44(extraout_var,iVar1));
  }
  if (this_01 != (MapLoaderAdapter *)0x0) {
    (*(this_01->super_MapLoader)._vptr_MapLoader[1])();
  }
  MAP1.field_2._12_4_ = 0;
  std::__cxx11::string::~string((string *)local_f0);
  std::__cxx11::string::~string(local_a0);
  MapLoader::~MapLoader((MapLoader *)local_58);
  std::__cxx11::string::~string(local_30);
  return MAP1.field_2._12_4_;
}

Assistant:

int main() {
    //init loader
    const std::string MAP1 = "debugValid.map";
    MapLoader myLoader = MapLoader(MAP1);

    //create first (valid) map
    std::cout << "creating map 1 (valid)\n";
    Map* firstMap = myLoader.readMapFile();
    std::cout << "\nmap 1 creation completed.\n";
    if (firstMap) {
        firstMap->printMap();
    }
    
    //create second (invalid) map
    /*
     * this map is invalid in many ways. Alaska is assigned to a continent
     * that doesnt exist, alberta has a wrong country ID and it is not a
     * connected graph (that can be tested for in Map.cpp).
     */
    std::cout << "\n\n";
    const std::string MAP2 = "world2Invalid.map";
    myLoader.setMapFile(MAP2);
    std::cout << "\ncreating map 2 (invalid)\n";
    Map* secondMap = myLoader.readMapFile();
    std::cout << "map 2 creation attempt completed.\n";
    if (secondMap) {
        secondMap->printMap();
    }

    //init alternative loader
    std::cout << "\n\n";
    const std::string MAP3 = "africa.map";
    auto* altLoader = new AlternativeLoader(MAP3);

    std::cout << "creating map 3 using alternative loader directly (valid)\n";
    Map* thirdMap = altLoader->altReadMapFile();
    std::cout << "\nmap 3 creation completed.\n";
    if (thirdMap) {
        thirdMap->printMap();
    }

    //init adapter
    std::cout << "\n\n";
    std::cout << "creating map 4 using adapter (valid)\n";
    auto* adapter = new MapLoaderAdapter(altLoader);
    Map* fourthMap = adapter->readMapFile();
    if (fourthMap) {
        fourthMap->printMap();
    }

    delete(adapter);

    return 0;
}